

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O3

void Am_Copy_Data_Into_Slot(Am_Object *dest_obj,Am_Slot_Key dest_slot,Am_Inter_Location *src_data)

{
  Am_Value *pAVar1;
  Am_Wrapper *value;
  Am_Inter_Location dest_data;
  Am_Inter_Location AStack_28;
  
  pAVar1 = Am_Object::Get(dest_obj,dest_slot,1);
  if ((pAVar1->type & 0x7000) == 0x2000) {
    Am_Inter_Location::Am_Inter_Location(&AStack_28);
    Am_Object::Make_Unique(dest_obj,dest_slot);
    pAVar1 = Am_Object::Get(dest_obj,dest_slot,0);
    Am_Inter_Location::operator=(&AStack_28,pAVar1);
    Am_Inter_Location::Copy_From(&AStack_28,src_data,false);
    Am_Object::Note_Changed(dest_obj,dest_slot);
  }
  else {
    Am_Inter_Location::Copy(&AStack_28);
    value = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&AStack_28);
    Am_Object::Set(dest_obj,dest_slot,value,1);
  }
  Am_Inter_Location::~Am_Inter_Location(&AStack_28);
  return;
}

Assistant:

void
Am_Copy_Data_Into_Slot(Am_Object dest_obj, Am_Slot_Key dest_slot,
                       Am_Inter_Location src_data)
{
  if (Am_Type_Class(dest_obj.Get_Slot_Type(dest_slot)) == Am_WRAPPER) {
    // then just copy the new data into the old data
    Am_Inter_Location dest_data;
    dest_obj.Make_Unique(dest_slot);
    dest_data = dest_obj.Get(dest_slot);
    dest_data.Copy_From(src_data, false);
    dest_obj.Note_Changed(dest_slot); //since destructively modified
  } else                              //set slot with a copy of data
    dest_obj.Set(dest_slot, src_data.Copy(), Am_OK_IF_NOT_THERE);
}